

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

size_t lm_trie_read_ug(lm_trie_t *trie,uint32 *counts,FILE *fp)

{
  size_t sVar1;
  size_t rv;
  FILE *fp_local;
  uint32 *counts_local;
  lm_trie_t *trie_local;
  
  sVar1 = fread(trie->unigrams,0xc,(ulong)(*counts + 1),(FILE *)fp);
  return sVar1;
}

Assistant:

static size_t
lm_trie_read_ug(lm_trie_t * trie, uint32 * counts, FILE * fp)
{
    size_t rv = fread(trie->unigrams, sizeof(*trie->unigrams),
                      (counts[0] + 1), fp);
    if (SWAP_LM_TRIE) {
        int i;
        for (i = 0; (uint32)i < counts[0] + 1; ++i) {
            SWAP_FLOAT32(&trie->unigrams[i].prob);
            SWAP_FLOAT32(&trie->unigrams[i].bo);
            SWAP_INT32(&trie->unigrams[i].next);
        }
    }
    return rv;
}